

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

bool __thiscall
mp::BasicSolver::ParseOptions
          (BasicSolver *this,char **argv,uint flags,ASLProblem *param_3,char *additional_options)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  string exe_basename;
  path p;
  string local_50 [32];
  
  this->has_errors_ = false;
  *(byte *)&this->bool_options_ = (byte)this->bool_options_ & 0xfe;
  this->option_flag_save_ = flags;
  if (additional_options != (char *)0x0) {
    ParseOptionString(this,additional_options,1);
    return false;
  }
  pcVar2 = getenv("mp_options");
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&p,"mp_options",(allocator<char> *)&exe_basename);
    WarnOnDifferentCapitalizations(&p.str_);
    std::__cxx11::string::~string((string *)&p);
    ParseOptionString(this,pcVar2,flags);
  }
  pcVar2 = (this->exe_path_)._M_dataplus._M_p;
  if (*pcVar2 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&exe_basename,pcVar2,(allocator<char> *)&ext);
    std::__cxx11::string::string((string *)&p,(string *)&exe_basename);
    std::__cxx11::string::~string((string *)&exe_basename);
    path::filename((path *)&ext,&p);
    std::__cxx11::string::string((string *)&exe_basename,(string *)&ext);
    std::__cxx11::string::~string((string *)&ext);
    lVar3 = std::__cxx11::string::rfind((char)&exe_basename,0x2e);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&ext,(ulong)&exe_basename);
      bVar1 = std::operator==(".exe",&ext);
      if ((bVar1) || (bVar1 = std::operator==(".app",&ext), bVar1)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&exe_basename);
        std::__cxx11::string::operator=((string *)&exe_basename,local_50);
        std::__cxx11::string::~string(local_50);
      }
      std::__cxx11::string::~string((string *)&ext);
    }
    std::operator+(&ext,&exe_basename,"_options");
    pcVar2 = getenv(ext._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&ext);
    if (pcVar2 != (char *)0x0) {
      std::operator+(&ext,&exe_basename,"_options");
      WarnOnDifferentCapitalizations(&ext);
      std::__cxx11::string::~string((string *)&ext);
      ParseOptionString(this,pcVar2,flags);
      std::__cxx11::string::~string((string *)&exe_basename);
      std::__cxx11::string::~string((string *)&p);
      goto LAB_0033a381;
    }
    std::__cxx11::string::~string((string *)&exe_basename);
    std::__cxx11::string::~string((string *)&p);
  }
  std::operator+(&p.str_,&this->name_,"_options");
  pcVar2 = getenv(p.str_._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&p.str_);
  if (pcVar2 != (char *)0x0) {
    std::operator+(&p.str_,&this->name_,"_options");
    WarnOnDifferentCapitalizations(&p.str_);
    std::__cxx11::string::~string((string *)&p);
    ParseOptionString(this,pcVar2,flags);
  }
LAB_0033a381:
  if (argv != (char **)0x0) {
    for (; *argv != (char *)0x0; argv = argv + 1) {
      ParseOptionString(this,*argv,flags | 2);
    }
  }
  if ((this->bool_options_ & 1) != 0) {
    ShowVersion(this);
  }
  return (bool)(this->has_errors_ ^ 1);
}

Assistant:

bool BasicSolver::ParseOptions(char **argv, unsigned flags, const ASLProblem *, char* additional_options) {
  has_errors_ = false;
  bool_options_ &= ~SHOW_VERSION;
  option_flag_save_ = flags;
  // 0. If additional options are specified, parse only those
  if (additional_options) {
    ParseOptionString(additional_options, NO_OPTION_ECHO);
    return false;
  }
  
  // 1. Try & parse 'mp_options'
  if (const char *s = std::getenv("mp_options")) {
    WarnOnDifferentCapitalizations("mp_options");
    ParseOptionString(s, flags);
  }
  bool had_exe_name_option_var = false;
  // 2. Try the '<solver_exe>_options' env var.
  const char *s = exe_path();
  if (std::strlen(s)) {
    path p(s);
    auto exe_basename = p.filename().string();
    auto pt = exe_basename.rfind('.');
    if (std::string::npos != pt) {
      auto ext = exe_basename.substr(pt);
      if (".exe"==ext || ".app"==ext)
        exe_basename = exe_basename.substr(0, pt);
    }
    if (const char *s
        = std::getenv((exe_basename + "_options").c_str())) {
      WarnOnDifferentCapitalizations(exe_basename + "_options");
      ParseOptionString(s, flags);
      had_exe_name_option_var = true;
    }
  }
  // 3. If no exe-name-specific options,
  // try '<solver_std_name>_options', such as 'gurobi_options'
  if (!had_exe_name_option_var)
  if (const char *s = std::getenv((name_ + "_options").c_str())) {
    WarnOnDifferentCapitalizations(name_ + "_options");
    ParseOptionString(s, flags);
  }
  // 4. Proceed to command-line options
  flags |= FROM_COMMAND_LINE;
  if (argv) {
    while (const char *s = *argv++) {
      ParseOptionString(s, flags);
    }
  }
  
  if ((bool_options_ & SHOW_VERSION) != 0)
    ShowVersion();
  return !has_errors_;
}